

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

void __thiscall Kvm::print(Kvm *this,Value *v,ostream *out)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RAX;
  size_t sVar3;
  long lVar4;
  _func_int **pp_Var5;
  char *pcVar6;
  char cVar7;
  undefined8 uStack_38;
  
  if (((ulong)v & 1) != 0) {
    std::ostream::_M_insert<long>((long)out);
    return;
  }
  uStack_38 = in_RAX;
  if (((ulong)v & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"#\\",2);
    cVar7 = (char)((ulong)v >> 2);
    if (cVar7 == '\t') {
      pcVar6 = "tab";
      sVar3 = 3;
    }
    else {
      uVar2 = (uint)((ulong)v >> 2) & 0xff;
      if (uVar2 == 0x20) {
        pcVar6 = "space";
        sVar3 = 5;
      }
      else {
        if (uVar2 != 10) {
          pcVar6 = (char *)((long)&uStack_38 + 7);
          uStack_38 = CONCAT17(cVar7,(undefined7)uStack_38);
          goto LAB_0010b248;
        }
        pcVar6 = "newline";
        sVar3 = 7;
      }
    }
    goto LAB_0010b2da;
  }
  switch(v->type_) {
  case BOOLEAN:
    pcVar6 = "#f";
    if (*(char *)&v[1]._vptr_Value != '\0') {
      pcVar6 = "#t";
    }
    goto LAB_0010b160;
  case STRING:
    std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
    pp_Var5 = v[1]._vptr_Value;
    do {
      bVar1 = *(byte *)pp_Var5;
      if (bVar1 < 0x22) {
        if (bVar1 == 10) {
          lVar4 = 2;
          pcVar6 = "\\n";
        }
        else {
          if (bVar1 == 0) goto LAB_0010b241;
LAB_0010b228:
          uStack_38._0_7_ = CONCAT16(bVar1,(undefined6)uStack_38);
          lVar4 = 1;
          pcVar6 = (char *)((long)&uStack_38 + 6);
        }
      }
      else if (bVar1 == 0x22) {
        lVar4 = 2;
        pcVar6 = "\\\"";
      }
      else {
        if (bVar1 != 0x5c) goto LAB_0010b228;
        lVar4 = 2;
        pcVar6 = "\\\\";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar4);
      pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
    } while( true );
  case NIL:
    pcVar6 = "()";
LAB_0010b160:
    sVar3 = 2;
    break;
  case CELL:
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    printCell(this,v,out);
    pcVar6 = ")";
    sVar3 = 1;
    break;
  case SYMBOL:
    pcVar6 = (char *)v[1]._vptr_Value;
    if ((_func_int **)pcVar6 == (_func_int **)0x0) {
      std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      return;
    }
    sVar3 = strlen(pcVar6);
    break;
  case PRIM_PROC:
    pcVar6 = "#<primitive-procedure";
    goto LAB_0010b274;
  case COMP_PROC:
    pcVar6 = "#<compound-procedure>";
LAB_0010b274:
    sVar3 = 0x15;
    break;
  case INPUT_PORT:
    pcVar6 = "#<input-port>";
    sVar3 = 0xd;
    break;
  case OUTPUT_PORT:
    pcVar6 = "#<output-port>";
    sVar3 = 0xe;
    break;
  case EOF_OBJECT:
    pcVar6 = "#<eof>";
    sVar3 = 6;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cannot write unknown type",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    return;
  }
LAB_0010b2da:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,sVar3);
  return;
LAB_0010b241:
  pcVar6 = "\"";
LAB_0010b248:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,1);
  return;
}

Assistant:

void Kvm::print(const Value *v, std::ostream& out)
{
    if (IS_INT(v))
    {
        out << TK_INT(v);
    } else if (IS_CHR(v))
    {
        char c = TK_CHR(v);
        out << "#\\";
        if (c == '\n')
        {
            out << "newline";
        } else if (c == ' ')
        {
            out << "space";
        } else if (c == '\t')
        {
            out << "tab";
        } else
        {
            out << c;
        }
    }
    else
    {
        switch (v->type())
        {
            case ValueType::BOOLEAN:
                out << (static_cast<const Boolean *>(v)->value_ ? "#t" : "#f");
                break;
            case ValueType::STRING:
                out << "\"";
                {
                    const char *c = static_cast<const String *>(v)->value_;
                    while (*c)
                    {
                        switch (*c)
                        {
                            case '\n':
                                out << "\\n";
                                break;
                            case '\\':
                                out << "\\\\";
                                break;
                            case '"':
                                out << "\\\"";
                                break;
                            default:
                                out << *c;
                                break;
                        }
                        ++c;
                    }
                }
                out << "\"";
                break;
            case ValueType::SYMBOL:
                out << static_cast<const Symbol *>(v)->value_;
                break;
            case ValueType::NIL:
                out << "()";
                break;
            case ValueType::CELL:
                out << "(";
                printCell(v, out);
                out << ")";
                break;
            case ValueType::PRIM_PROC:
                out << "#<primitive-procedure";
                break;
            case ValueType::COMP_PROC:
                out << "#<compound-procedure>";
                break;
            case ValueType::INPUT_PORT:
                out << "#<input-port>";
                break;
            case ValueType::OUTPUT_PORT:
                out << "#<output-port>";
                break;
            case ValueType::EOF_OBJECT:
                out << "#<eof>";
                break;
            default:
                cerr << "cannot write unknown type" << endl;
                break;
        }
    }
}